

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

void packLE(uint8_t *p,uint32_t value,uint8_t u8Size)

{
  uint32_t local_14;
  uint8_t u8Size_local;
  uint8_t *puStack_10;
  uint32_t value_local;
  uint8_t *p_local;
  
  if ((u8Size != '\0') && (u8Size < 5)) {
    local_14 = value;
    puStack_10 = p;
    memcpy(p,&local_14,(ulong)u8Size);
  }
  return;
}

Assistant:

void packLE(_PACK_UINT8* p, _PACK_UINT32 value, _PACK_UINT8 u8Size)
{
   if ((u8Size > 0) && (u8Size <= sizeof(_PACK_UINT32)))
   {
#if defined(PLATFORM_BYTE_ORDER) && (PLATFORM_BYTE_ORDER==PLATFORM_LITTLE_ENDIAN)
      memcpy(p, &value, u8Size);
#else

      register _PACK_UINT32 tmp = value;
      while (u8Size > 0)
      {
         *(p++) = (_PACK_UINT8)tmp;
         tmp = tmp >> 8;
         u8Size--;
      }
#endif
   }
}